

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindFileByName_Test::TestBody
          (DescriptorDatabaseTest_FindFileByName_Test *this)

{
  DescriptorDatabase *pDVar1;
  internal iVar2;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  FileDescriptorProto file;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  AssertHelper local_128;
  Message local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  FileDescriptorProto local_110;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,"name: \"foo.proto\" message_type { name:\"Foo\" }"
            );
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,"name: \"bar.proto\" message_type { name:\"Bar\" }"
            );
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"foo.proto","");
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,local_148,&local_110);
  local_120.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = SUB41(iVar3,0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  iVar2 = local_120.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_;
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
    iVar2 = (internal)
            ((byte)local_120.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_ & 1);
  }
  if (iVar2 == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)&local_120,
               (AssertionResult *)"database_->FindFileByName(\"foo.proto\", &file)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa1,(char *)local_148);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_148 != (undefined1  [8])&local_138) {
      operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_118,local_118);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_148,"\"foo.proto\"","file.name()",(char (*) [10])0x119907e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_110.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_148[0] == (string)0x0) {
    testing::Message::Message(&local_120);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    if ((long *)CONCAT71(local_120.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_120.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_120.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_120.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Foo","");
  ExpectContainsType(&local_110,(string *)local_148);
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"bar.proto","");
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,local_148,&local_110);
  local_120.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = SUB41(iVar3,0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  iVar2 = local_120.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_;
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
    iVar2 = (internal)
            ((byte)local_120.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_ & 1);
  }
  if (iVar2 == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)&local_120,
               (AssertionResult *)"database_->FindFileByName(\"bar.proto\", &file)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa8,(char *)local_148);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_148 != (undefined1  [8])&local_138) {
      operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_118,local_118);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_148,"\"bar.proto\"","file.name()",(char (*) [10])0x119946a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_110.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_148[0] == (string)0x0) {
    testing::Message::Message(&local_120);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    if ((long *)CONCAT71(local_120.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_120.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_120.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_120.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Bar","");
  ExpectContainsType(&local_110,(string *)local_148);
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"baz.proto","");
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,local_148,&local_110);
  local_120.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)((byte)iVar3 ^ 1);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
  }
  if ((byte)iVar3 != 0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)&local_120,
               (AssertionResult *)"database_->FindFileByName(\"baz.proto\", &file)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xb0,(char *)local_148);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_148 != (undefined1  [8])&local_138) {
      operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
    if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_118,local_118);
    }
  }
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindFileByName) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { name:\"Foo\" }");
  AddToDatabase(
      "name: \"bar.proto\" "
      "message_type { name:\"Bar\" }");

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileByName("foo.proto", &file));
    EXPECT_EQ("foo.proto", file.name());
    ExpectContainsType(file, "Foo");
  }

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileByName("bar.proto", &file));
    EXPECT_EQ("bar.proto", file.name());
    ExpectContainsType(file, "Bar");
  }

  {
    // Fails to find undefined files.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileByName("baz.proto", &file));
  }
}